

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall
FTypeTable::ReplaceType(FTypeTable *this,PType *newtype,PType *oldtype,size_t bucket)

{
  PType *pPVar1;
  PType *type;
  PType **type_p;
  size_t bucket_local;
  PType *oldtype_local;
  PType *newtype_local;
  FTypeTable *this_local;
  
  type = (PType *)(this->TypeHash + bucket);
  while( true ) {
    if ((type->super_PTypeBase).super_DObject._vptr_DObject == (_func_int **)0x0) {
      return;
    }
    pPVar1 = (PType *)(type->super_PTypeBase).super_DObject._vptr_DObject;
    if (pPVar1 == oldtype) break;
    type = (PType *)((type->super_PTypeBase).super_DObject._vptr_DObject + 6);
  }
  newtype->HashNext = pPVar1->HashNext;
  pPVar1->HashNext = (PType *)0x0;
  (type->super_PTypeBase).super_DObject._vptr_DObject = (_func_int **)newtype;
  return;
}

Assistant:

void FTypeTable::ReplaceType(PType *newtype, PType *oldtype, size_t bucket)
{
	for (PType **type_p = &TypeHash[bucket]; *type_p != NULL; type_p = &(*type_p)->HashNext)
	{
		PType *type = *type_p;
		if (type == oldtype)
		{
			newtype->HashNext = type->HashNext;
			type->HashNext = NULL;
			*type_p = newtype;
			break;
		}
	}
}